

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::execute
          (TessEvaluationExecutor *this,int numValues,void **inputs,void **outputs)

{
  int iVar1;
  undefined4 extraout_var;
  uint numValues_00;
  long lVar2;
  
  iVar1 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  numValues_00 = numValues + 1U & 0xfffffffe;
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues_00);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  if ((this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs.
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs.
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (**(code **)(lVar2 + 0x48))
              (0x90d2,0,(this->super_BufferIoExecutor).m_inputBuffer.super_ObjectWrapper.m_object);
  }
  (**(code **)(lVar2 + 0x48))
            (0x90d2,1,(this->super_BufferIoExecutor).m_outputBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar2 + 0xfd8))(0x8e72,2);
  (**(code **)(lVar2 + 0x538))(0xe,0,numValues_00);
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void TessEvaluationExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const int				alignedValues	= deAlign32(numValues, 2);

	// Initialize buffers with aligned value count to make room for padding
	initBuffers(alignedValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	// \todo [2014-06-26 pyry] Duplicate last value in the buffer to prevent infinite loops for example?

	if (!m_inputs.empty())
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer());

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer());

	// Render patches
	gl.patchParameteri(GL_PATCH_VERTICES, 2);
	gl.drawArrays(GL_PATCHES, 0, alignedValues);

	// Read back data
	readOutputBuffer(outputs, numValues);
}